

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

bool __thiscall spv::Builder::isStorageImageType(Builder *this,Id typeId)

{
  Instruction *pIVar1;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId];
  if (pIVar1->opCode == OpTypeImage) {
    return *(int *)(*(long *)&(pIVar1->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data + 0x14) == 2;
  }
  __assert_fail("isImageType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                ,0xe7,"bool spv::Builder::isStorageImageType(Id) const");
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }